

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__gif_header(stbi__context *s,stbi__gif *g,int *comp,int is_info)

{
  stbi_uc sVar1;
  byte bVar2;
  int iVar3;
  long in_FS_OFFSET;
  
  sVar1 = stbi__get8(s);
  if (((((sVar1 != 'G') || (sVar1 = stbi__get8(s), sVar1 != 'I')) ||
       (sVar1 = stbi__get8(s), sVar1 != 'F')) ||
      ((sVar1 = stbi__get8(s), sVar1 != '8' ||
       ((sVar1 = stbi__get8(s), sVar1 != '7' && (sVar1 != '9')))))) ||
     (sVar1 = stbi__get8(s), sVar1 != 'a')) {
    *(char **)(in_FS_OFFSET + -0x10) = "not GIF";
    return 0;
  }
  *(char **)(in_FS_OFFSET + -0x10) = "";
  iVar3 = stbi__get16le(s);
  g->w = iVar3;
  iVar3 = stbi__get16le(s);
  g->h = iVar3;
  bVar2 = stbi__get8(s);
  g->flags = (uint)bVar2;
  bVar2 = stbi__get8(s);
  g->bgindex = (uint)bVar2;
  bVar2 = stbi__get8(s);
  g->ratio = (uint)bVar2;
  g->transparent = -1;
  if (comp != (int *)0x0) {
    *comp = 4;
  }
  if (is_info != 0) {
    return 1;
  }
  bVar2 = (byte)g->flags;
  if (-1 < (char)bVar2) {
    return 1;
  }
  stbi__gif_parse_colortable(s,g->pal,2 << (bVar2 & 7),-1);
  return 1;
}

Assistant:

static int stbi__gif_header(stbi__context *s, stbi__gif *g, int *comp, int is_info)
{
   stbi_uc version;
   if (stbi__get8(s) != 'G' || stbi__get8(s) != 'I' || stbi__get8(s) != 'F' || stbi__get8(s) != '8')
      return stbi__err("not GIF", "Corrupt GIF");

   version = stbi__get8(s);
   if (version != '7' && version != '9')    return stbi__err("not GIF", "Corrupt GIF");
   if (stbi__get8(s) != 'a')                return stbi__err("not GIF", "Corrupt GIF");

   stbi__g_failure_reason = "";
   g->w = stbi__get16le(s);
   g->h = stbi__get16le(s);
   g->flags = stbi__get8(s);
   g->bgindex = stbi__get8(s);
   g->ratio = stbi__get8(s);
   g->transparent = -1;

   if (comp != 0) *comp = 4;  // can't actually tell whether it's 3 or 4 until we parse the comments

   if (is_info) return 1;

   if (g->flags & 0x80)
      stbi__gif_parse_colortable(s,g->pal, 2 << (g->flags & 7), -1);

   return 1;
}